

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall QDockAreaLayoutInfo::setCurrentTabId(QDockAreaLayoutInfo *this,quintptr id)

{
  int iVar1;
  QTabBar *pQVar2;
  QTabBar *in_RSI;
  QTabBar *in_RDI;
  long in_FS_OFFSET;
  int i;
  QTabBar *in_stack_ffffffffffffffa0;
  int index;
  int local_3c;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI[2].super_QWidget.field_0x8 & 1) != 0) &&
     (*(long *)&in_RDI[2].super_QWidget.super_QPaintDevice != 0)) {
    local_3c = 0;
    while (index = local_3c, iVar1 = QTabBar::count(in_stack_ffffffffffffffa0), index < iVar1) {
      QTabBar::tabData(in_RDI,index);
      pQVar2 = (QTabBar *)qvariant_cast<unsigned_long_long>((QVariant *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa0 = in_RSI;
      ::QVariant::~QVariant(&local_28);
      if (pQVar2 == in_stack_ffffffffffffffa0) {
        QTabBar::setCurrentIndex(in_RDI,index);
        break;
      }
      local_3c = local_3c + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::setCurrentTabId(quintptr id)
{
    if (!tabbed || tabBar == nullptr)
        return;

    for (int i = 0; i < tabBar->count(); ++i) {
        if (qvariant_cast<quintptr>(tabBar->tabData(i)) == id) {
            tabBar->setCurrentIndex(i);
            return;
        }
    }
}